

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool __thiscall
QObjectPrivate::isSignalConnected(QObjectPrivate *this,uint signalIndex,bool checkDeclarative)

{
  bool bVar1;
  uint uVar2;
  Type pCVar3;
  Type this_00;
  Type pCVar4;
  Type pQVar5;
  byte in_DL;
  uint in_ESI;
  undefined8 in_RDI;
  Connection *c;
  SignalVector *signalVector;
  ConnectionData *cd;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar6;
  QObjectPrivate *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (((in_DL & 1) == 0) ||
     (bVar1 = isDeclarativeSignalConnected(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20)),
     !bVar1)) {
    pCVar3 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                       ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3eb386);
    if (pCVar3 == (Type)0x0) {
      local_1 = false;
    }
    else {
      this_00 = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                          ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3eb3ab);
      if (this_00 == (Type)0x0) {
        local_1 = false;
      }
      else {
        SignalVector::at(this_00,-1);
        pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                           ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eb3d9);
        if (pCVar4 == (Type)0x0) {
          uVar6 = in_ESI;
          uVar2 = ConnectionData::signalVectorCount
                            ((ConnectionData *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
          if (uVar6 < uVar2) {
            SignalVector::at(this_00,in_ESI);
            pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                               ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eb418);
            while (pCVar4 != (Type)0x0) {
              pQVar5 = QBasicAtomicPointer<QObject>::loadRelaxed
                                 ((QBasicAtomicPointer<QObject> *)0x3eb433);
              if (pQVar5 != (Type)0x0) {
                return true;
              }
              pCVar4 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                 ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3eb44e);
            }
          }
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QObjectPrivate::isSignalConnected(uint signalIndex, bool checkDeclarative) const
{
    if (checkDeclarative && isDeclarativeSignalConnected(signalIndex))
        return true;

    ConnectionData *cd = connections.loadAcquire();
    if (!cd)
        return false;
    SignalVector *signalVector = cd->signalVector.loadRelaxed();
    if (!signalVector)
        return false;

    if (signalVector->at(-1).first.loadRelaxed())
        return true;

    if (signalIndex < uint(cd->signalVectorCount())) {
        const QObjectPrivate::Connection *c = signalVector->at(signalIndex).first.loadRelaxed();
        while (c) {
            if (c->receiver.loadRelaxed())
                return true;
            c = c->nextConnectionList.loadRelaxed();
        }
    }
    return false;
}